

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr-writer-test.cc
# Opt level: O0

void __thiscall
ExprWriterTest_WriteBinaryLogicalExpr_Test::TestBody
          (ExprWriterTest_WriteBinaryLogicalExpr_Test *this)

{
  NumericExpr lhs;
  NumericExpr lhs_00;
  LogicalExpr lhs_01;
  NumericExpr else_expr;
  LogicalExpr lhs_02;
  NumericExpr else_expr_00;
  LogicalExpr lhs_03;
  NumericExpr else_expr_01;
  CStringRef arg0;
  CStringRef arg0_00;
  CStringRef arg0_01;
  bool bVar1;
  undefined1 uVar2;
  ExprBase other;
  AssertHelper *this_00;
  long in_RDI;
  AssertHelper *this_01;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  RelationalExpr e2;
  RelationalExpr e1;
  ExprWriterTest *in_stack_fffffffffffffcf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd00;
  undefined7 in_stack_fffffffffffffd08;
  undefined1 in_stack_fffffffffffffd0f;
  ExprBase in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  int line;
  ExprBase in_stack_fffffffffffffd20;
  char *file;
  ExprBase in_stack_fffffffffffffd28;
  Type type;
  AssertHelper *in_stack_fffffffffffffd30;
  undefined7 in_stack_fffffffffffffd38;
  undefined1 in_stack_fffffffffffffd3f;
  Message *message;
  char local_1f8 [8];
  BasicCStringRef<char> local_1f0;
  string local_1e8 [32];
  AssertionResult local_1c8 [2];
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_1a8;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_198;
  Impl *local_188;
  Impl *local_178;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_168;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_158;
  BasicCStringRef<char> local_148;
  string local_140 [32];
  AssertionResult local_120 [3];
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_f0;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_e0;
  Impl *local_d0;
  Impl *local_c0;
  BasicExpr<(mp::expr::Kind)50,_(mp::expr::Kind)52> local_b0;
  BasicExpr<(mp::expr::Kind)39,_(mp::expr::Kind)39> local_a0;
  BasicCStringRef<char> local_90;
  string local_88 [32];
  AssertionResult local_68;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_58;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_48;
  ExprBase local_38;
  BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)1> local_30;
  BasicExpr<(mp::expr::Kind)2,_(mp::expr::Kind)3> local_20;
  BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58> local_10;
  
  this_01 = (AssertHelper *)(in_RDI + 0x10);
  local_20.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffcf8,0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (Reference)in_stack_fffffffffffffd10.impl_,
             (type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  message = (Message *)0x0;
  local_30.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffcf8,5.72784137061841e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (NumericConstant)in_stack_fffffffffffffd10.impl_,
             (type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  lhs.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd1c;
  lhs.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd18;
  local_10.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeRelational
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                  (Kind)((ulong)in_stack_fffffffffffffd00 >> 0x20),lhs,
                  (NumericExpr)in_stack_fffffffffffffd10.impl_);
  local_48.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeVariable
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffcf8,0);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::Reference>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (Reference)in_stack_fffffffffffffd10.impl_,
             (type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  local_58.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffcf8,5.72859235040009e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (NumericConstant)in_stack_fffffffffffffd10.impl_,
             (type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  lhs_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd1c;
  lhs_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd18;
  local_38.impl_ =
       (Impl *)mp::BasicExprFactory<std::allocator<char>_>::MakeRelational
                         ((BasicExprFactory<std::allocator<char>_> *)
                          CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                          (Kind)((ulong)in_stack_fffffffffffffd00 >> 0x20),lhs_00,
                          (NumericExpr)in_stack_fffffffffffffd10.impl_);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_90,"{}");
  local_c0 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )in_stack_fffffffffffffd10.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  local_d0 = local_38.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )in_stack_fffffffffffffd10.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  lhs_01.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd1c;
  lhs_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd18;
  local_b0.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                  (Kind)((ulong)in_stack_fffffffffffffd00 >> 0x20),lhs_01,
                  (LogicalExpr)in_stack_fffffffffffffd10.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffd10.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  local_e0.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffcf8,5.72994609026969e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (NumericConstant)in_stack_fffffffffffffd10.impl_,
             (type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  local_f0.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffcf8,5.7302178263749e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (NumericConstant)in_stack_fffffffffffffd10.impl_,
             (type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  else_expr.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd1c;
  else_expr.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd18;
  local_a0.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffd10.impl_,
                  (LogicalExpr)in_stack_fffffffffffffd28.impl_,
                  (NumericExpr)in_stack_fffffffffffffd20.impl_,else_expr);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             in_stack_fffffffffffffd10.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  arg0.data_._7_1_ = in_stack_fffffffffffffd3f;
  arg0.data_._0_7_ = in_stack_fffffffffffffd38;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffd30);
  testing::internal::EqHelper<false>::Compare<char[28],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             (char *)in_stack_fffffffffffffd10.impl_,
             (char (*) [28])CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  std::__cxx11::string::~string(local_88);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_68);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    testing::AssertionResult::failure_message((AssertionResult *)0x11b3d1);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,(Type)((ulong)in_stack_fffffffffffffd28.impl_ >> 0x20),
               (char *)in_stack_fffffffffffffd20.impl_,in_stack_fffffffffffffd1c,
               (char *)in_stack_fffffffffffffd10.impl_);
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd00);
    testing::Message::~Message((Message *)0x11b42e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b486);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_148,"{}");
  local_178 = (Impl *)local_10.super_ExprBase.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )in_stack_fffffffffffffd10.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  local_188 = local_38.impl_;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )in_stack_fffffffffffffd10.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  lhs_02.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd1c;
  lhs_02.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd18;
  local_168.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
                 ((BasicExprFactory<std::allocator<char>_> *)
                  CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
                  (Kind)((ulong)in_stack_fffffffffffffd00 >> 0x20),lhs_02,
                  (LogicalExpr)in_stack_fffffffffffffd10.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )in_stack_fffffffffffffd10.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  local_198.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffcf8,5.73376027705558e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (NumericConstant)in_stack_fffffffffffffd10.impl_,
             (type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  local_1a8.super_ExprBase.impl_ =
       (ExprBase)ExprWriterTest::MakeConst(in_stack_fffffffffffffcf8,5.73398754725267e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (NumericConstant)in_stack_fffffffffffffd10.impl_,
             (type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  else_expr_00.super_ExprBase.impl_._4_4_ = in_stack_fffffffffffffd1c;
  else_expr_00.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd18;
  local_158.super_ExprBase.impl_ =
       (ExprBase)
       mp::BasicExprFactory<std::allocator<char>_>::MakeIf
                 ((BasicExprFactory<std::allocator<char>_> *)in_stack_fffffffffffffd10.impl_,
                  (LogicalExpr)in_stack_fffffffffffffd28.impl_,
                  (NumericExpr)in_stack_fffffffffffffd20.impl_,else_expr_00);
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             in_stack_fffffffffffffd10.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  arg0_00.data_._7_1_ = in_stack_fffffffffffffd3f;
  arg0_00.data_._0_7_ = in_stack_fffffffffffffd38;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0_00,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffd30);
  testing::internal::EqHelper<false>::Compare<char[28],std::__cxx11::string>
            ((char *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18),
             (char *)in_stack_fffffffffffffd10.impl_,
             (char (*) [28])CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  std::__cxx11::string::~string(local_140);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(local_120);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    in_stack_fffffffffffffd30 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11b6c9);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,(Type)((ulong)in_stack_fffffffffffffd28.impl_ >> 0x20),
               (char *)in_stack_fffffffffffffd20.impl_,in_stack_fffffffffffffd1c,
               (char *)in_stack_fffffffffffffd10.impl_);
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_fffffffffffffd00);
    testing::Message::~Message((Message *)0x11b726);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11b77e);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_1f0,"{}");
  other.impl_ = (Impl *)(in_RDI + 0x10);
  line = 0;
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )other.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)53,(mp::expr::Kind)58>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>
              )other.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  lhs_03.super_ExprBase.impl_._4_4_ = line;
  lhs_03.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd18;
  mp::BasicExprFactory<std::allocator<char>_>::MakeBinaryLogical
            ((BasicExprFactory<std::allocator<char>_> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (Kind)((ulong)in_stack_fffffffffffffd00 >> 0x20),lhs_03,(LogicalExpr)other.impl_);
  mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>::
  BasicExpr<mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,(mp::expr::Kind)69>,(mp::expr::Kind)50,(mp::expr::Kind)52>>
            ((BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)50,_(mp::expr::Kind)52>
              )other.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  ExprWriterTest::MakeConst(in_stack_fffffffffffffcf8,5.73751517596398e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (NumericConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  ExprWriterTest::MakeConst(in_stack_fffffffffffffcf8,5.73774244616107e-318);
  mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>::BasicExpr<mp::NumericConstant>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (NumericConstant)other.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  else_expr_01.super_ExprBase.impl_._4_4_ = line;
  else_expr_01.super_ExprBase.impl_._0_4_ = in_stack_fffffffffffffd18;
  mp::BasicExprFactory<std::allocator<char>_>::MakeIf
            ((BasicExprFactory<std::allocator<char>_> *)other.impl_,
             (LogicalExpr)in_stack_fffffffffffffd28.impl_,
             (NumericExpr)in_stack_fffffffffffffd20.impl_,else_expr_01);
  file = local_1f8;
  mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>::
  BasicExpr<mp::BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)39>>
            ((BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)
             CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             (BasicIfExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)39>)
             other.impl_,(type)((ulong)in_stack_fffffffffffffd00 >> 0x20));
  type = (Type)((ulong)local_1e8 >> 0x20);
  arg0_01.data_._7_1_ = uVar2;
  arg0_01.data_._0_7_ = in_stack_fffffffffffffd38;
  fmt::format<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>>
            (arg0_01,(BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47> *)in_stack_fffffffffffffd30);
  testing::internal::EqHelper<false>::Compare<char[30],std::__cxx11::string>
            ((char *)CONCAT44(line,in_stack_fffffffffffffd18),(char *)other.impl_,
             (char (*) [30])CONCAT17(in_stack_fffffffffffffd0f,in_stack_fffffffffffffd08),
             in_stack_fffffffffffffd00);
  std::__cxx11::string::~string(local_1e8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_1c8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffd30);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0x11b9c1)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_fffffffffffffd30,type,file,line,(char *)other.impl_);
    testing::internal::AssertHelper::operator=(this_01,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x11ba1e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x11ba73);
  return;
}

Assistant:

TEST_F(ExprWriterTest, WriteBinaryLogicalExpr) {
  auto e1 = MakeRelational(ex::GT, MakeVariable(0), MakeConst(0));
  auto e2 = MakeRelational(ex::LT, MakeVariable(0), MakeConst(10));
  CHECK_WRITE("if x1 > 0 || x1 < 10 then 1",
      MakeIf(MakeBinaryLogical(ex::OR, e1, e2), MakeConst(1), MakeConst(0)));
  CHECK_WRITE("if x1 > 0 && x1 < 10 then 1",
      MakeIf(MakeBinaryLogical(ex::AND, e1, e2), MakeConst(1), MakeConst(0)));
  CHECK_WRITE("if x1 > 0 <==> x1 < 10 then 1",
      MakeIf(MakeBinaryLogical(ex::IFF, e1, e2), MakeConst(1), MakeConst(0)));
}